

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_p.h
# Opt level: O2

void __thiscall QShortcutPrivate::~QShortcutPrivate(QShortcutPrivate *this)

{
  *(undefined ***)this = &PTR__QShortcutPrivate_0078a1e8;
  QArrayDataPointer<int>::~QArrayDataPointer(&(this->sc_ids).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->sc_whatsthis).d);
  QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&(this->sc_sequences).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

class Q_GUI_EXPORT QShortcutPrivate : public QObjectPrivate
{
    Q_DECLARE_PUBLIC(QShortcut)
public:
    QShortcutPrivate() = default;

    virtual QShortcutMap::ContextMatcher contextMatcher() const;
    virtual bool handleWhatsThis() { return false; }

    static bool simpleContextMatcher(QObject *object, Qt::ShortcutContext context);

    QList<QKeySequence> sc_sequences;
    QString sc_whatsthis;
    Qt::ShortcutContext sc_context = Qt::WindowShortcut;
    bool sc_enabled = true;
    bool sc_autorepeat = true;
    QList<int> sc_ids;
    void redoGrab(QShortcutMap &map);
}